

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.h
# Opt level: O0

Error __thiscall
llvm::handleErrorImpl<llvm::errorToErrorCode(llvm::Error)::__0>
          (llvm *this,
          unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *Payload,
          anon_class_8_1_3fcf615c *Handler)

{
  anon_class_8_1_3fcf615c *H;
  bool bVar1;
  type E;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> local_30;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> local_28;
  anon_class_8_1_3fcf615c *local_20;
  anon_class_8_1_3fcf615c *Handler_local;
  unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *Payload_local;
  
  local_20 = Handler;
  Handler_local = (anon_class_8_1_3fcf615c *)Payload;
  Payload_local = (unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_> *)this
  ;
  E = std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::operator*
                (Payload);
  bVar1 = ErrorHandlerTraits<void_(&)(llvm::ErrorInfoBase_&)>::appliesTo(E);
  H = local_20;
  if (bVar1) {
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::unique_ptr
              (&local_28,Payload);
    ErrorHandlerTraits<void(&)(llvm::ErrorInfoBase&)>::
    apply<llvm::errorToErrorCode(llvm::Error)::__0>
              ((ErrorHandlerTraits<void(&)(llvm::ErrorInfoBase&)> *)this,H,&local_28);
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::~unique_ptr
              (&local_28);
  }
  else {
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::unique_ptr
              (&local_30,Payload);
    handleErrorImpl(this,&local_30);
    std::unique_ptr<llvm::ErrorInfoBase,_std::default_delete<llvm::ErrorInfoBase>_>::~unique_ptr
              (&local_30);
  }
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error handleErrorImpl(std::unique_ptr<ErrorInfoBase> Payload,
                      HandlerT &&Handler, HandlerTs &&... Handlers) {
  if (ErrorHandlerTraits<HandlerT>::appliesTo(*Payload))
    return ErrorHandlerTraits<HandlerT>::apply(std::forward<HandlerT>(Handler),
                                               std::move(Payload));
  return handleErrorImpl(std::move(Payload),
                         std::forward<HandlerTs>(Handlers)...);
}